

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

smart_ptr<re2c::DFA> __thiscall
re2c::compile(re2c *this,Spec *spec,Output *output,string *cond,uint32_t cunits)

{
  _Rb_tree_header *p_Var1;
  uint32_t dfa_line;
  _Base_ptr p_Var2;
  Skeleton *this_00;
  DFA *this_01;
  undefined8 *puVar3;
  ulong uVar4;
  long *extraout_RDX;
  long *extraout_RDX_00;
  long *plVar5;
  smart_ptr<re2c::DFA> sVar6;
  charset_t cs;
  uint32_t cunits_local;
  string name;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fill;
  dfa_t dfa;
  nfa_t nfa;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> bounds;
  ios_base local_138 [264];
  
  cunits_local = cunits;
  dfa_line = OutputFile::get_block_line(&output->source);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&bounds);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&bounds,"line",4);
  std::ostream::_M_insert<unsigned_long>((ulong)&bounds);
  p_Var1 = &bounds._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  if (cond->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&name);
    std::__cxx11::string::_M_append((char *)&name,(ulong)(cond->_M_dataplus)._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bounds);
  std::ios_base::~ios_base(local_138);
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bounds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (*spec->re->_vptr_RegExp[2])(spec->re,&bounds);
  dfa.states.super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_insert_unique<unsigned_int>(&bounds._M_t,(uint *)&dfa);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&bounds,&cunits_local);
  cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if ((_Rb_tree_header *)bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var2 = bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&cs,
                   (iterator)
                   cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&p_Var2[1]._M_color);
      }
      else {
        *cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = p_Var2[1]._M_color;
        cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  nfa_t::nfa_t(&nfa,spec->re);
  dfa_t::dfa_t(&dfa,&nfa,&cs,&spec->rules);
  this_00 = (Skeleton *)operator_new(0x90);
  Skeleton::Skeleton(this_00,&dfa,&cs,&spec->rules,&name,cond,dfa_line);
  minimization(&dfa);
  fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fillpoints(&dfa,&fill);
  this_01 = (DFA *)operator_new(0x88);
  DFA::DFA(this_01,&dfa,&fill,this_00,&cs,&name,cond,dfa_line);
  DFA::reorder(this_01);
  DFA::prepare(this_01);
  DFA::calc_stats(this_01);
  uVar4 = this_01->max_fill;
  if (this_01->max_fill < output->max_fill) {
    uVar4 = output->max_fill;
  }
  output->max_fill = uVar4;
  if (this_01->need_accept == true) {
    OutputFile::set_used_yyaccept(&output->source);
  }
  *(DFA **)this = this_01;
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = 1;
  *(undefined8 **)(this + 8) = puVar3;
  if (fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  dfa_t::~dfa_t(&dfa);
  nfa_t::~nfa_t(&nfa);
  if (cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&bounds._M_t);
  plVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    plVar5 = extraout_RDX_00;
  }
  sVar6.count = plVar5;
  sVar6.ptr = (DFA *)this;
  return sVar6;
}

Assistant:

smart_ptr<DFA> compile (Spec & spec, Output & output, const std::string & cond, uint32_t cunits)
{
	const uint32_t line = output.source.get_block_line();
	const std::string name = make_name(cond, line);

	// The original set of code units (charset) might be very large.
	// A common trick it is to split charset into disjoint character ranges
	// and choose a representative of each range (we choose lower bound).
	// The set of all representatives is the new (compacted) charset.
	// Don't forget to include zero and upper bound, even if they
	// do not explicitely apper in ranges.
	std::set<uint32_t> bounds;
	spec.re->split(bounds);
	bounds.insert(0);
	bounds.insert(cunits);
	charset_t cs;
	for (std::set<uint32_t>::const_iterator i = bounds.begin(); i != bounds.end(); ++i)
	{
		cs.push_back(*i);
	}

	nfa_t nfa(spec.re);

	dfa_t dfa(nfa, cs, spec.rules);

	// skeleton must be constructed after DFA construction
	// but prior to any other DFA transformations
	Skeleton *skeleton = new Skeleton(dfa, cs, spec.rules, name, cond, line);

	minimization(dfa);

	// find YYFILL states and calculate argument to YYFILL
	std::vector<size_t> fill;
	fillpoints(dfa, fill);

	// ADFA stands for 'DFA with actions'
	DFA *adfa = new DFA(dfa, fill, skeleton, cs, name, cond, line);

	/*
	 * note [reordering DFA states]
	 *
	 * re2c-generated code depends on the order of states in DFA: simply
	 * flipping two states may change the output significantly.
	 * The order of states is affected by many factors, e.g.:
	 *   - flipping left and right subtrees of alternative when constructing
	 *     AST (also applies to iteration and counted repetition)
	 *   - changing the order in which graph nodes are visited (applies to
	 *     any intermediate representation: bytecode, NFA, DFA, etc.)
	 *
	 * To make the resulting code independent of such changes, we hereby
	 * reorder DFA states. The ordering scheme is very simple:
	 *
	 * Starting with DFA root, walk DFA nodes in breadth-first order.
	 * Child nodes are ordered accoding to the (alphabetically) first symbol
	 * leading to each node. Each node must be visited exactly once.
	 * Default state (NULL) is always the last state.
	 */
	adfa->reorder();

	// skeleton is constructed, do further DFA transformations
	adfa->prepare();

	// finally gather overall DFA statistics
	adfa->calc_stats();

	// accumulate global statistics from this particular DFA
	output.max_fill = std::max (output.max_fill, adfa->max_fill);
	if (adfa->need_accept)
	{
		output.source.set_used_yyaccept ();
	}

	return make_smart_ptr(adfa);
}